

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::HandleEnergyReport(CommissionerImpl *this,Request *aRequest)

{
  bool bVar1;
  Endpoint *pEVar2;
  Error *pEVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  ByteArray *pBVar6;
  char *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_3c8;
  anon_class_1_0_00000001 local_3a2;
  v10 local_3a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  char *local_398;
  string local_390;
  allocator local_369;
  string local_368;
  ErrorCode local_348;
  key_type local_341;
  undefined1 local_340 [8];
  mapped_type eneryListTlv;
  Error local_328;
  key_type local_2f9;
  undefined1 local_2f8 [8];
  mapped_type channelMaskTlv;
  Error local_2e0;
  anon_class_1_0_00000001 local_2b2;
  v10 local_2b1;
  v10 *local_2b0;
  char *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  allocator local_279;
  string local_278;
  Address local_248;
  undefined1 local_230 [8];
  string peerAddr;
  ByteArray energyList;
  ChannelMask channelMask;
  TlvSet tlvSet;
  Error error;
  Request *aRequest_local;
  CommissionerImpl *this_local;
  undefined1 local_168 [16];
  v10 *local_158;
  char *local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  v10 *local_140;
  char *pcStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  undefined1 local_108 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  char *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  v10 *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8;
  CommissionerImpl **local_a0;
  undefined1 *local_98;
  CommissionerImpl **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  CommissionerImpl **local_78;
  v10 **local_70;
  v10 *local_68;
  char *pcStack_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  char *pcStack_10;
  
  Error::Error((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&channelMask.
            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
          *)&energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&peerAddr.field_2 + 8))
  ;
  pEVar2 = coap::Message::GetEndpoint(aRequest);
  (*pEVar2->_vptr_Endpoint[3])(&local_248);
  Address::ToString_abi_cxx11_((string *)local_230,&local_248);
  Address::~Address(&local_248);
  std::allocator<char>::allocator();
  this_00 = "mgmt";
  std::__cxx11::string::string((string *)&local_278,"mgmt",&local_279);
  HandleEnergyReport::anon_class_1_0_00000001::operator()(&local_2b2);
  local_b8 = &local_2b0;
  local_c0 = &local_2b1;
  bVar7 = ::fmt::v10::operator()(local_c0);
  local_2a8 = (char *)bVar7.size_;
  local_2b0 = (v10 *)bVar7.data_;
  ::fmt::v10::detail::
  check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
            ();
  local_130 = &local_2a0;
  local_140 = local_2b0;
  pcStack_138 = local_2a8;
  local_148 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_230;
  local_70 = &local_140;
  local_158 = local_2b0;
  local_150 = local_2a8;
  local_68 = local_158;
  pcStack_60 = local_150;
  this_local = (CommissionerImpl *)
               ::fmt::v10::
               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                         (local_148,(v10 *)this_00,local_130);
  local_98 = local_168;
  local_a0 = &this_local;
  local_88 = 0xd;
  fmt.size_ = 0xd;
  fmt.data_ = local_150;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)local_a0;
  local_90 = local_a0;
  local_80 = local_98;
  local_78 = local_a0;
  ::fmt::v10::vformat_abi_cxx11_(&local_2a0,local_158,fmt,args);
  Log(kInfo,&local_278,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  ProxyClient::SendEmptyChanged(&this->mProxyClient,aRequest);
  GetTlvSet(&local_2e0,
            (TlvSet *)
            &channelMask.
             super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,aRequest,kMeshCoP);
  pEVar3 = Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &local_2e0);
  channelMaskTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  bVar1 = commissioner::operator!=
                    (pEVar3,(ErrorCode *)
                            ((long)&channelMaskTlv.
                                    super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 4));
  Error::~Error(&local_2e0);
  if (bVar1) goto LAB_002816ff;
  local_2f9 = kChannelMask;
  pmVar4 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&channelMask.
                            super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2f9);
  std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
            ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2f8,pmVar4);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2f8);
  if (bVar1) {
    peVar5 = std::
             __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_2f8);
    pBVar6 = tlv::Tlv::GetValue(peVar5);
    DecodeChannelMask(&local_328,
                      (ChannelMask *)
                      &energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,pBVar6);
    pEVar3 = Error::operator=((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              &local_328);
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 0;
    bVar1 = commissioner::operator!=
                      (pEVar3,(ErrorCode *)
                              ((long)&eneryListTlv.
                                      super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi + 4));
    Error::~Error(&local_328);
    if (!bVar1) goto LAB_002815ef;
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 6;
  }
  else {
LAB_002815ef:
    eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = 0;
  }
  std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
            ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2f8);
  if ((int)eneryListTlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi == 0) {
    local_341 = kEnergyList;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&channelMask.
                              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_341);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_340,pmVar4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_340);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_340);
      pBVar6 = tlv::Tlv::GetValue(peVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&peerAddr.field_2 + 8),pBVar6);
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_340);
    (*this->mCommissionerHandler->_vptr_CommissionerHandler[5])
              (this->mCommissionerHandler,local_230,
               &energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,
               (undefined1 *)((long)&peerAddr.field_2 + 8));
  }
LAB_002816ff:
  local_348 = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_348);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,"mgmt",&local_369);
    HandleEnergyReport::anon_class_1_0_00000001::operator()(&local_3a2);
    local_a8 = &local_3a0;
    local_b0 = &local_3a1;
    bVar7 = ::fmt::v10::operator()(local_b0);
    local_398 = (char *)bVar7.size_;
    local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar7.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FMT_COMPILE_STRING,_0>
              ();
    Error::ToString_abi_cxx11_
              (&local_3c8,(Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_c8 = &local_390;
    local_d8 = local_3a0;
    pcStack_d0 = local_398;
    local_e0 = (v10 *)local_230;
    local_e8 = &local_3c8;
    local_20 = &local_d8;
    local_f8 = local_3a0;
    local_f0 = local_398;
    local_18 = local_f8;
    pcStack_10 = local_f0;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
              (&local_128,local_e0,local_e8,local_3a0);
    local_48 = local_108;
    local_50 = &local_128;
    local_38 = 0xdd;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = local_f0;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_50;
    local_40 = local_50;
    local_30 = local_48;
    local_28 = local_50;
    ::fmt::v10::vformat_abi_cxx11_(&local_390,(v10 *)local_f8,fmt_00,args_00);
    Log(kWarn,&local_368,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
  }
  std::__cxx11::string::~string((string *)local_230);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&peerAddr.field_2 + 8))
  ;
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)&energyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&channelMask.
             super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Error::~Error((Error *)&tlvSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void CommissionerImpl::HandleEnergyReport(const coap::Request &aRequest)
{
    Error       error;
    tlv::TlvSet tlvSet;
    ChannelMask channelMask;
    ByteArray   energyList;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MGMT, "received MGMT_ED_REPORT.ans from {}", peerAddr);

    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = GetTlvSet(tlvSet, aRequest));
    if (auto channelMaskTlv = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(error = DecodeChannelMask(channelMask, channelMaskTlv->GetValue()));
    }
    if (auto eneryListTlv = tlvSet[tlv::Type::kEnergyList])
    {
        energyList = eneryListTlv->GetValue();
    }

    mCommissionerHandler.OnEnergyReport(peerAddr, channelMask, energyList);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_MGMT, "handle MGMT_ED_REPORT.ans from {} failed: {}", peerAddr, error.ToString());
    }
}